

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_write_pcm_frames_be(drwav *pWav,drwav_uint64 framesToWrite,void *pData)

{
  drwav_uint32 dVar1;
  uint uVar2;
  size_t sVar3;
  void *in_RDX;
  long in_RSI;
  drwav *in_RDI;
  drwav_uint64 bytesToWriteThisIteration;
  size_t bytesJustWritten;
  drwav_uint32 sampleCount;
  drwav_uint8 temp [4096];
  drwav_uint8 *pRunningData;
  drwav_uint32 bytesPerSample;
  drwav_uint64 bytesWritten;
  drwav_uint64 bytesToWrite;
  drwav_uint64 iSample_5;
  drwav_uint64 iSample;
  drwav_uint64 iSample_2;
  drwav_uint64 iSample_3;
  drwav_uint8 *pSample;
  drwav_uint64 iSample_1;
  drwav_uint8 t;
  drwav_uint64 iSample_4;
  anon_union_8_2_947300a4 x_1;
  anon_union_4_2_947300a4 x;
  uint in_stack_ffffffffffffee68;
  uint in_stack_ffffffffffffee6c;
  undefined1 *__dest;
  size_t local_1180;
  undefined1 local_1168 [4096];
  void *local_168;
  uint local_15c;
  long local_158;
  ulong local_150;
  drwav *local_138;
  ulong local_130;
  ushort local_126;
  uint local_124;
  ulong local_120;
  undefined1 *local_118;
  ulong local_110;
  ulong local_108;
  undefined1 *local_100;
  uint local_f4;
  ulong local_f0;
  undefined1 *local_e8;
  ulong local_e0;
  ulong local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined1 *local_b8;
  uint local_ac;
  ulong local_a8;
  undefined1 *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  ulong local_78;
  ulong local_70;
  undefined1 *local_68;
  undefined1 local_59;
  undefined1 *local_58;
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ushort local_1c;
  ushort local_1a;
  ushort local_18;
  ushort local_16;
  uint local_14;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  if (((in_RDI == (drwav *)0x0) || (in_RSI == 0)) || (in_RDX == (void *)0x0)) {
    local_130 = 0;
  }
  else {
    local_150 = in_RSI * (ulong)in_RDI->channels * (ulong)in_RDI->bitsPerSample >> 3;
    local_158 = 0;
    local_168 = in_RDX;
    local_138 = in_RDI;
    dVar1 = drwav_get_bytes_per_pcm_frame(in_RDI);
    local_15c = dVar1 / local_138->channels;
    for (; local_150 != 0; local_150 = local_150 - sVar3) {
      local_1180 = local_150;
      uVar2 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(local_15c),0);
      if ((ulong)uVar2 * (ulong)local_15c < local_150) {
        local_1180 = (ulong)uVar2 * (ulong)local_15c;
      }
      __dest = local_1168;
      memcpy(__dest,local_168,local_1180);
      local_120 = (ulong)uVar2;
      local_126 = local_138->translatedFormatTag;
      local_124 = local_15c;
      switch((drwav *)(ulong)(local_126 - 1)) {
      case (drwav *)0x0:
        local_f4 = local_15c;
        in_stack_ffffffffffffee6c = local_15c;
        local_f0 = local_120;
        local_e8 = __dest;
        if (local_15c == 2) {
          for (local_e0 = 0; local_d8 = local_120, local_d0 = __dest, local_e0 < local_120;
              local_e0 = local_e0 + 1) {
            local_1c = *(ushort *)(__dest + local_e0 * 2);
            *(ushort *)(__dest + local_e0 * 2) = local_1c << 8 | local_1c >> 8;
            local_1a = local_1c;
          }
        }
        else if (local_15c == 3) {
          for (local_78 = 0; local_70 = local_120, local_68 = __dest, local_78 < local_120;
              local_78 = local_78 + 1) {
            local_80 = __dest + local_78 * 3;
            local_59 = *local_80;
            *local_80 = local_80[2];
            local_80[2] = local_59;
            local_58 = local_80;
          }
        }
        else if (local_15c == 4) {
          for (local_c8 = 0; local_c0 = local_120, local_b8 = __dest, local_c8 < local_120;
              local_c8 = local_c8 + 1) {
            local_8 = *(uint *)(__dest + local_c8 * 4);
            *(uint *)(__dest + local_c8 * 4) =
                 local_8 >> 0x18 | (local_8 & 0xff0000) >> 8 | (local_8 & 0xff00) << 8 |
                 local_8 << 0x18;
            local_4 = local_8;
          }
        }
        break;
      case (drwav *)0x1:
      case (drwav *)0x10:
      default:
        break;
      case (drwav *)0x2:
        local_ac = local_15c;
        in_stack_ffffffffffffee68 = local_15c;
        local_a8 = local_120;
        local_a0 = __dest;
        if (local_15c == 4) {
          for (local_98 = 0; local_90 = local_120, local_88 = __dest, local_98 < local_120;
              local_98 = local_98 + 1) {
            local_10 = *(uint *)(__dest + local_98 * 4);
            local_14 = local_10 >> 0x18 | (local_10 & 0xff0000) >> 8 | (local_10 & 0xff00) << 8 |
                       local_10 << 0x18;
            *(uint *)(__dest + local_98 * 4) = local_14;
            local_c = local_10;
          }
        }
        else if (local_15c == 8) {
          for (local_50 = 0; local_48 = local_120, local_40 = __dest, local_50 < local_120;
              local_50 = local_50 + 1) {
            local_30 = *(ulong *)(__dest + local_50 * 8);
            local_38 = local_30 >> 0x38 | (local_30 & 0xff000000000000) >> 0x28 |
                       (local_30 & 0xff0000000000) >> 0x18 | (local_30 & 0xff00000000) >> 8 |
                       (local_30 & 0xff000000) << 8 | (local_30 & 0xff0000) << 0x18 |
                       (local_30 & 0xff00) << 0x28 | local_30 << 0x38;
            *(ulong *)(__dest + local_50 * 8) = local_38;
            local_28 = local_30;
          }
        }
        break;
      case (drwav *)0x5:
      case (drwav *)0x6:
        for (local_110 = 0; local_108 = local_120, local_100 = __dest, local_110 < local_120;
            local_110 = local_110 + 1) {
          local_18 = *(ushort *)(__dest + local_110 * 2);
          *(ushort *)(__dest + local_110 * 2) = local_18 << 8 | local_18 >> 8;
          local_16 = local_18;
        }
      }
      local_118 = __dest;
      sVar3 = drwav_write_raw((drwav *)(ulong)(local_126 - 1),(size_t)__dest,
                              (void *)CONCAT44(in_stack_ffffffffffffee6c,in_stack_ffffffffffffee68))
      ;
      if (sVar3 == 0) break;
      local_158 = sVar3 + local_158;
      local_168 = (void *)(sVar3 + (long)local_168);
    }
    local_130 = ((ulong)(local_158 << 3) / (ulong)local_138->bitsPerSample) /
                (ulong)local_138->channels;
  }
  return local_130;
}

Assistant:

DRWAV_API drwav_uint64 drwav_write_pcm_frames_be(drwav* pWav, drwav_uint64 framesToWrite, const void* pData)
{
    drwav_uint64 bytesToWrite;
    drwav_uint64 bytesWritten;
    drwav_uint32 bytesPerSample;
    const drwav_uint8* pRunningData;

    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }

    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    bytesWritten = 0;
    pRunningData = (const drwav_uint8*)pData;

    bytesPerSample = drwav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    
    while (bytesToWrite > 0) {
        drwav_uint8 temp[4096];
        drwav_uint32 sampleCount;
        size_t bytesJustWritten;
        drwav_uint64 bytesToWriteThisIteration;

        bytesToWriteThisIteration = bytesToWrite;
        DRWAV_ASSERT(bytesToWriteThisIteration <= DRWAV_SIZE_MAX);  /* <-- This is checked above. */

        /*
        WAV files are always little-endian. We need to byte swap on big-endian architectures. Since our input buffer is read-only we need
        to use an intermediary buffer for the conversion.
        */
        sampleCount = sizeof(temp)/bytesPerSample;

        if (bytesToWriteThisIteration > ((drwav_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((drwav_uint64)sampleCount)*bytesPerSample;
        }

        DRWAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        drwav__bswap_samples(temp, sampleCount, bytesPerSample, pWav->translatedFormatTag);

        bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}